

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O0

void __thiscall
ParticleFilter::dataAssociation
          (ParticleFilter *this,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *map_landmarks_in_range,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations_in_map_coordinates)

{
  size_type sVar1;
  reference pvVar2;
  double dVar3;
  double dVar4;
  undefined1 local_80 [8];
  LandmarkObs l;
  double d;
  double delta_y;
  double delta_x;
  double dStack_48;
  int j;
  double dist_comp;
  int map_index;
  int i;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> result;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations_in_map_coordinates_local;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> *map_landmarks_in_range_local;
  ParticleFilter *this_local;
  
  result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)observations_in_map_coordinates;
  std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
            ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&map_index);
  dist_comp._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::size
                      ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
                       result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (sVar1 <= (ulong)(long)dist_comp._4_4_) break;
    dStack_48 = 1e+99;
    delta_x._4_4_ = 0;
    while( true ) {
      sVar1 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::size(map_landmarks_in_range);
      if (sVar1 <= (ulong)(long)delta_x._4_4_) break;
      pvVar2 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         (map_landmarks_in_range,(long)delta_x._4_4_);
      dVar3 = pvVar2->x;
      pvVar2 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
                          result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)dist_comp._4_4_);
      dVar3 = dVar3 - pvVar2->x;
      pvVar2 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         (map_landmarks_in_range,(long)delta_x._4_4_);
      dVar4 = pvVar2->y;
      pvVar2 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
                          result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)dist_comp._4_4_);
      dVar4 = dVar4 - pvVar2->y;
      l.y = dVar3 * dVar3 + dVar4 * dVar4;
      if (l.y < dStack_48) {
        dist_comp._0_4_ = delta_x._4_4_;
        dStack_48 = l.y;
      }
      delta_x._4_4_ = delta_x._4_4_ + 1;
    }
    local_80._0_4_ = dist_comp._0_4_;
    pvVar2 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                       ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
                        result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,(long)dist_comp._4_4_);
    l._0_8_ = pvVar2->x;
    pvVar2 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                       ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
                        result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,(long)dist_comp._4_4_);
    l.x = pvVar2->y;
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&map_index,
               (value_type *)local_80);
    dist_comp._4_4_ = dist_comp._4_4_ + 1;
  }
  std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator=
            ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
             result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&map_index);
  std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector
            ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&map_index);
  return;
}

Assistant:

void ParticleFilter::dataAssociation(std::vector<LandmarkObs> map_landmarks_in_range, std::vector<LandmarkObs>& observations_in_map_coordinates) 
{
  std::vector<LandmarkObs> result;
  for (int i=0; i<observations_in_map_coordinates.size(); i++)
  {
    int map_index;
    double dist_comp = 1.0e99;
    for (int j=0; j<map_landmarks_in_range.size(); j++)
    {
      double delta_x = map_landmarks_in_range[j].x - observations_in_map_coordinates[i].x;
      double delta_y = map_landmarks_in_range[j].y - observations_in_map_coordinates[i].y;
      double d = delta_x * delta_x + delta_y * delta_y; 
      if (d < dist_comp)
      {
        map_index = j;
        dist_comp = d;
      } 
    }
    LandmarkObs l = {map_index, observations_in_map_coordinates[i].x, observations_in_map_coordinates[i].y};
    result.push_back(l);
  }
  observations_in_map_coordinates = result;
}